

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int remainingElementsCount_add(JSContext *ctx,JSValue resolve_element_env,int addend)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  JSValue JVar4;
  int remainingElementsCount;
  uint local_3c;
  ulong local_38;
  undefined8 uStack_30;
  
  JVar4 = JS_GetPropertyValue(ctx,resolve_element_env,(JSValue)ZEXT816(0));
  uVar3 = 0xffffffff;
  if ((int)JVar4.tag != 6) {
    iVar1 = JS_ToInt32Free(ctx,(int32_t *)&local_3c,JVar4);
    if (iVar1 == 0) {
      uVar2 = addend + local_3c;
      local_38 = CONCAT44(0,uVar2);
      uStack_30 = 0;
      JVar4.tag = 0;
      JVar4.u = (JSValueUnion)local_38;
      local_3c = uVar2;
      iVar1 = JS_SetPropertyValue(ctx,resolve_element_env,(JSValue)ZEXT816(0),JVar4,0x4000);
      if (-1 < iVar1) {
        uVar3 = (uint)(uVar2 == 0);
      }
    }
  }
  return uVar3;
}

Assistant:

static __exception int remainingElementsCount_add(JSContext *ctx,
                                                  JSValueConst resolve_element_env,
                                                  int addend)
{
    JSValue val;
    int remainingElementsCount;

    val = JS_GetPropertyUint32(ctx, resolve_element_env, 0);
    if (JS_IsException(val))
        return -1;
    if (JS_ToInt32Free(ctx, &remainingElementsCount, val))
        return -1;
    remainingElementsCount += addend;
    if (JS_SetPropertyUint32(ctx, resolve_element_env, 0,
                             JS_NewInt32(ctx, remainingElementsCount)) < 0)
        return -1;
    return (remainingElementsCount == 0);
}